

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_world(void)

{
  level_conflict *plVar1;
  level_conflict *old;
  level_conflict *level;
  
  old = (level_conflict *)world;
  while (old != (level_conflict *)0x0) {
    string_free(old->name);
    string_free(old->up);
    string_free(old->down);
    plVar1 = old->next;
    mem_free(old);
    old = plVar1;
  }
  return;
}

Assistant:

static void cleanup_world(void)
{
	struct level *level = world;
	while (level) {
		struct level *old = level;
		string_free(level->name);
		string_free(level->up);
		string_free(level->down);
		level = level->next;
		mem_free(old);
	}
}